

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdentifierCopier.cpp
# Opt level: O0

void __thiscall
phaeton::IdentifierCopier::transformIdentifierExpr(IdentifierCopier *this,IdentifierExpr *Node)

{
  list<phaeton::CodeGen::Assignment,_std::allocator<phaeton::CodeGen::Assignment>_> *this_00;
  bool bVar1;
  ExprDims *pEVar2;
  ExprDims *__y;
  ExpressionNodeBuilder *pEVar3;
  IdentifierExpr *pIVar4;
  value_type local_d8;
  const_iterator local_c8;
  IdentifierExpr *local_c0;
  ExpressionNode *NewRHSId;
  IdentifierExpr *local_98;
  ExpressionNode *CopyLHSId;
  ExpressionNode *NewIdNode;
  string Tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  IdentifierExpr *local_18;
  IdentifierExpr *Node_local;
  IdentifierCopier *this_local;
  
  local_18 = Node;
  Node_local = (IdentifierExpr *)this;
  (*(Node->super_ExpressionNode)._vptr_ExpressionNode[7])(&local_38);
  (*(this->CurrentLHS->super_ExpressionNode)._vptr_ExpressionNode[7])(&local_58);
  bVar1 = std::operator!=(&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  if (!bVar1) {
    pEVar2 = ExpressionNode::getDims(&local_18->super_ExpressionNode);
    __y = ExpressionNode::getDims(&this->CurrentLHS->super_ExpressionNode);
    bVar1 = std::operator==(pEVar2,__y);
    if (!bVar1) {
      __assert_fail("Node->getDims() == CurrentLHS->getDims()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/lib/Opt/IdentifierCopier.cpp"
                    ,0x58,
                    "virtual void phaeton::IdentifierCopier::transformIdentifierExpr(IdentifierExpr *)"
                   );
    }
    if ((this->Incompatible & 1U) != 0) {
      bVar1 = std::operator!=(&this->ReplaceName,"");
      if (bVar1) {
        std::__cxx11::string::string((string *)&NewIdNode,(string *)&this->ReplaceName);
      }
      else {
        getTmp_abi_cxx11_((string *)&NewIdNode,this);
      }
      pEVar3 = getExprNodeBuilder(this);
      pEVar2 = ExpressionNode::getDims(&local_18->super_ExpressionNode);
      CopyLHSId = &ExpressionNodeBuilder::createIdentifierExpr(pEVar3,(string *)&NewIdNode,pEVar2)->
                   super_ExpressionNode;
      ExpressionNode::setChild(this->Parent,this->ChildIndex,CopyLHSId);
      bVar1 = std::operator==(&this->ReplaceName,"");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)&this->ReplaceName,(string *)&NewIdNode);
        pEVar3 = getExprNodeBuilder(this);
        (*(this->CurrentLHS->super_ExpressionNode)._vptr_ExpressionNode[7])(&NewRHSId);
        pEVar2 = ExpressionNode::getDims(&this->CurrentLHS->super_ExpressionNode);
        pIVar4 = ExpressionNodeBuilder::createIdentifierExpr(pEVar3,(string *)&NewRHSId,pEVar2);
        std::__cxx11::string::~string((string *)&NewRHSId);
        local_98 = pIVar4;
        pEVar3 = getExprNodeBuilder(this);
        pEVar2 = ExpressionNode::getDims(&local_18->super_ExpressionNode);
        local_c0 = ExpressionNodeBuilder::createIdentifierExpr(pEVar3,&this->ReplaceName,pEVar2);
        this_00 = this->Assignments;
        std::_List_const_iterator<phaeton::CodeGen::Assignment>::_List_const_iterator
                  (&local_c8,&this->CurrentPos);
        local_d8.LHS = &local_c0->super_ExpressionNode;
        local_d8.RHS = &local_98->super_ExpressionNode;
        std::__cxx11::
        list<phaeton::CodeGen::Assignment,_std::allocator<phaeton::CodeGen::Assignment>_>::insert
                  (this_00,local_c8,&local_d8);
      }
      std::__cxx11::string::~string((string *)&NewIdNode);
    }
  }
  return;
}

Assistant:

void IdentifierCopier::transformIdentifierExpr(IdentifierExpr *Node) {
  // Note that current identifier should be different from 'LHS'.
  if (Node->getName() != CurrentLHS->getName()) {
    return;
  }

  // Note that identifiers with the same name must have the same type, here we
  // only check the dimension.
  assert(Node->getDims() == CurrentLHS->getDims());

  // If index structures of 'LHS' and the current identifier are compatible
  if (!Incompatible) {
    return;
  }

  // If we get here, that means current identifier must be replaced.
  // If there isn't a replacement for the identifier yet, we need to create a
  // name for it.
  const std::string Tmp = (ReplaceName != "") ? ReplaceName : getTmp();

  ExpressionNode *NewIdNode =
      getExprNodeBuilder()->createIdentifierExpr(Tmp, Node->getDims());
  Parent->setChild(ChildIndex, NewIdNode);

  // Note that if there wasn't a replacement identifier, we can simply assign
  // 'LHS' to it.
  if (ReplaceName == "") {
    ReplaceName = Tmp;
    ExpressionNode *CopyLHSId = getExprNodeBuilder()->createIdentifierExpr(
        CurrentLHS->getName(), CurrentLHS->getDims());
    ExpressionNode *NewRHSId = getExprNodeBuilder()->createIdentifierExpr(
        ReplaceName, Node->getDims());
    // Note: Replacement identifier for 'RHS' must be assigned the
    // value of 'LHS' before current assignment.
    // TODO: To make the insertion clear, we need to add a wrapper for
    // insertBefore and insertAfter.
    Assignments.insert(CurrentPos, {NewRHSId, CopyLHSId});
  }
}